

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Builder::LoadDyndeps(Builder *this,Node *node,string *err)

{
  bool bVar1;
  DyndepFile ddf;
  _Rb_tree<Edge_*,_std::pair<Edge_*const,_Dyndeps>,_std::_Select1st<std::pair<Edge_*const,_Dyndeps>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
  local_50;
  
  (*this->status_->_vptr_Status[3])();
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = DependencyScan::LoadDyndeps(&this->scan_,node,(DyndepFile *)&local_50,err);
  if (bVar1) {
    bVar1 = Plan::DyndepsLoaded(&this->plan_,&this->scan_,node,(DyndepFile *)&local_50,err);
    if (bVar1) {
      bVar1 = true;
      (**this->status_->_vptr_Status)(this->status_,(ulong)(uint)(this->plan_).command_edges_);
      goto LAB_0010cafd;
    }
  }
  bVar1 = false;
LAB_0010cafd:
  std::
  _Rb_tree<Edge_*,_std::pair<Edge_*const,_Dyndeps>,_std::_Select1st<std::pair<Edge_*const,_Dyndeps>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
  ::~_Rb_tree(&local_50);
  return bVar1;
}

Assistant:

bool Builder::LoadDyndeps(Node* node, string* err) {
  status_->BuildLoadDyndeps();

  // Load the dyndep information provided by this node.
  DyndepFile ddf;
  if (!scan_.LoadDyndeps(node, &ddf, err))
    return false;

  // Update the build plan to account for dyndep modifications to the graph.
  if (!plan_.DyndepsLoaded(&scan_, node, ddf, err))
    return false;

  // New command edges may have been added to the plan.
  status_->PlanHasTotalEdges(plan_.command_edge_count());

  return true;
}